

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall ProblemTest_AddObj_Test::TestBody(ProblemTest_AddObj_Test *this)

{
  pointer pBVar1;
  bool bVar2;
  int iVar3;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar4;
  NumericConstant expr;
  LinearObjBuilder this_00;
  AssertHelperData *pAVar5;
  pointer pLVar6;
  int iVar7;
  long lVar8;
  char *pcVar9;
  char *in_R9;
  size_t index;
  ulong uVar10;
  size_t index_1;
  AssertHelper *actual;
  string *this_01;
  MutObjective MVar11;
  int indices [2];
  AssertionResult gtest_ar_;
  double coefs [2];
  int num_terms;
  Problem p;
  AssertHelper local_3f0;
  Message local_3e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  AssertHelper local_3d8;
  AssertHelper local_3d0;
  string local_3c8;
  AssertHelper local_3a8;
  int local_39c;
  long local_398;
  BasicProblem<mp::BasicProblemParams<int>_> *local_390;
  BasicProblem<mp::BasicProblemParams<int>_> local_388;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_388);
  local_3e8.ss_.ptr_._0_4_ = 0;
  local_3f0.data_._0_4_ =
       (int)((ulong)((long)local_388.linear_objs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_388.linear_objs_.
                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"0","p.num_objs()",(int *)&local_3e8,(int *)&local_3f0);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xbc,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&local_388,MIN,(NumericExpr)0x0,0);
  local_3e8.ss_.ptr_._0_4_ = 1;
  local_3f0.data_._0_4_ =
       (int)((ulong)((long)local_388.linear_objs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_388.linear_objs_.
                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"1","p.num_objs()",(int *)&local_3e8,(int *)&local_3f0);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xbf,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar11 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_388,0);
  pBVar4 = MVar11.
           super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3e8.ss_.ptr_._0_4_ = 0;
  iVar7 = MVar11.
          super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uVar10 = (ulong)iVar7;
  iVar3 = iVar7 + 0x3f;
  if (-1 < iVar7) {
    iVar3 = iVar7;
  }
  local_3f0.data_._0_4_ =
       (uint)(((pBVar4->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar3 >> 6) +
                (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar10 & 0x3f) & 1) != 0);
  testing::internal::CmpHelperEQ<mp::obj::Type,mp::obj::Type>
            ((internal *)&local_3c8,"mp::obj::MIN","obj.type()",(Type *)&local_3e8,
             (Type *)&local_3f0);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xc1,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pBVar1 = (pBVar4->nonlinear_objs_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar10 < (ulong)((long)(pBVar4->nonlinear_objs_).
                             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    bVar2 = pBVar1[uVar10].super_ExprBase.impl_ == (Impl *)0x0;
    local_3e8.ss_.ptr_._0_4_ = CONCAT31(local_3e8.ss_.ptr_._1_3_,bVar2);
    local_3e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_3f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_3c8,(internal *)&local_3e8,(AssertionResult *)"!obj.nonlinear_expr()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0xc2,local_3c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if (local_3f0.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_3f0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_3f0.data_ + 8))();
        }
      }
    }
  }
  else {
    local_3e8.ss_.ptr_._0_4_ = CONCAT31(local_3e8.ss_.ptr_._1_3_,1);
    local_3e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3e8.ss_.ptr_._0_4_ = 0;
  local_3f0.data_._0_4_ =
       *(undefined4 *)
        ((long)&(pBVar4->linear_objs_).
                super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10].terms_.
                super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data + 0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"0","obj.linear_expr().num_terms()",(int *)&local_3e8,
             (int *)&local_3f0);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xc3,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&local_388,MAX,(NumericExpr)0x0,0);
  local_3e8.ss_.ptr_._0_4_ = 2;
  local_3f0.data_._0_4_ =
       (int)((ulong)((long)local_388.linear_objs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_388.linear_objs_.
                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"2","p.num_objs()",(int *)&local_3e8,(int *)&local_3f0);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xc6,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar11 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_388,1);
  pBVar4 = MVar11.
           super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3e8.ss_.ptr_._0_4_ = 1;
  iVar7 = MVar11.
          super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uVar10 = (ulong)iVar7;
  iVar3 = iVar7 + 0x3f;
  if (-1 < iVar7) {
    iVar3 = iVar7;
  }
  local_3f0.data_._0_4_ =
       (uint)(((pBVar4->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar3 >> 6) +
                (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar10 & 0x3f) & 1) != 0);
  testing::internal::CmpHelperEQ<mp::obj::Type,mp::obj::Type>
            ((internal *)&local_3c8,"mp::obj::MAX","obj.type()",(Type *)&local_3e8,
             (Type *)&local_3f0);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               200,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pBVar1 = (pBVar4->nonlinear_objs_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar10 < (ulong)((long)(pBVar4->nonlinear_objs_).
                             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    bVar2 = pBVar1[uVar10].super_ExprBase.impl_ == (Impl *)0x0;
    local_3e8.ss_.ptr_._0_4_ = CONCAT31(local_3e8.ss_.ptr_._1_3_,bVar2);
    local_3e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_3f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_3c8,(internal *)&local_3e8,(AssertionResult *)"!obj.nonlinear_expr()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0xc9,local_3c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_3d0,(Message *)&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      if (local_3f0.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_3f0.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_3f0.data_ + 8))();
        }
      }
    }
  }
  else {
    local_3e8.ss_.ptr_._0_4_ = CONCAT31(local_3e8.ss_.ptr_._1_3_,1);
    local_3e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3e8.ss_.ptr_._0_4_ = 0;
  local_3f0.data_._0_4_ =
       *(undefined4 *)
        ((long)&(pBVar4->linear_objs_).
                super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10].terms_.
                super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data + 0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"0","obj.linear_expr().num_terms()",(int *)&local_3e8,
             (int *)&local_3f0);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xca,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expr = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                   (&local_388.super_ExprFactory,42.0);
  this_00 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj
                      (&local_388,MIN,
                       (NumericExpr)
                       expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                       impl_,0);
  local_3c8._M_dataplus._M_p._0_4_ = 0;
  local_3c8._M_string_length = (size_type)&DAT_3ff199999999999a;
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::
  append_element<mp::LinearExpr::Term>
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)this_00.expr_,
             (Term *)&local_3c8);
  local_3c8._M_dataplus._M_p._0_4_ = 3;
  local_3c8._M_string_length = (size_type)&DAT_400199999999999a;
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::
  append_element<mp::LinearExpr::Term>
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)this_00.expr_,
             (Term *)&local_3c8);
  local_3e8.ss_.ptr_._0_4_ = 3;
  local_3f0.data_._0_4_ =
       (int)((ulong)((long)local_388.linear_objs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_388.linear_objs_.
                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3c8,"3","p.num_objs()",(int *)&local_3e8,(int *)&local_3f0);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xd0,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar11 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_388,2);
  pBVar4 = MVar11.
           super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3e8.ss_.ptr_._0_4_ = 0;
  iVar7 = MVar11.
          super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uVar10 = (ulong)iVar7;
  iVar3 = iVar7 + 0x3f;
  if (-1 < iVar7) {
    iVar3 = iVar7;
  }
  actual = &local_3f0;
  local_3f0.data_._0_4_ =
       (uint)(((pBVar4->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar3 >> 6) +
                (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar10 & 0x3f) & 1) != 0);
  this_01 = &local_3c8;
  testing::internal::CmpHelperEQ<mp::obj::Type,mp::obj::Type>
            ((internal *)this_01,"mp::obj::MIN","obj.type()",(Type *)&local_3e8,(Type *)actual);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xd2,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    if (CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3e8.ss_.ptr_._4_4_,local_3e8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3f0.data_ = (AssertHelperData *)0x300000000;
  local_3c8._M_dataplus._M_p = &DAT_3ff199999999999a;
  local_3c8._M_string_length = (size_type)&DAT_400199999999999a;
  local_39c = 2;
  local_3d0.data_._0_4_ =
       *(undefined4 *)
        ((long)&(pBVar4->linear_objs_).
                super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10].terms_.
                super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data + 0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_3e8,"num_terms","obj.linear_expr().num_terms()",&local_39c,
             (int *)&local_3d0);
  if (local_3e8.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3d0);
    if (local_3e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_3e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xd5,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3d0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d0.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pLVar6 = (pBVar4->linear_objs_).
           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar5 = *(AssertHelperData **)
            &pLVar6[uVar10].terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>
             .m_data;
  lVar8 = uVar10 * 0x78;
  local_3d0.data_ = pAVar5;
  if (0 < local_39c) {
    lVar8 = 0;
    local_398 = uVar10 * 0x78;
    local_390 = pBVar4;
    do {
      local_3d8.data_._0_4_ = (local_3d0.data_)->type;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_3e8,"indices[i]","it->var_index()",(int *)actual,
                 (int *)&local_3d8);
      if (local_3e8.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_3d8);
        pcVar9 = "";
        if (local_3e0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((local_3e0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc"
                   ,0xd5,pcVar9);
        testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        if (local_3d8.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_3d8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_3e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_3d8.data_ = (AssertHelperData *)(local_3d0.data_)->file;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_3e8,"coefs[i]","it->coef()",(double *)this_01,
                 (double *)&local_3d8);
      if (local_3e8.ss_.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_3d8);
        pcVar9 = "";
        if (local_3e0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((local_3e0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc"
                   ,0xd5,pcVar9);
        testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        if (local_3d8.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_3d8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_3e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar8 = lVar8 + 1;
      local_3d0.data_ = (AssertHelperData *)&(local_3d0.data_)->line;
      this_01 = (string *)&this_01->_M_string_length;
      actual = (AssertHelper *)((long)&actual->data_ + 4);
    } while (lVar8 < local_39c);
    pLVar6 = (local_390->linear_objs_).
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar5 = *(AssertHelperData **)
              ((long)&(pLVar6->terms_).
                      super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data +
              local_398);
    lVar8 = local_398;
  }
  local_3d8.data_ =
       (AssertHelperData *)
       (&pAVar5->type +
       *(long *)((long)&(pLVar6->terms_).
                        super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data +
                lVar8 + 0x10) * 4);
  testing::internal::
  CmpHelperEQ<gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            ((internal *)&local_3e8,"obj.linear_expr().end()","it",
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)&local_3d8,
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)&local_3d0);
  if (local_3e8.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_3d8);
    if (local_3e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_3e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0xd5,pcVar9);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (local_3d8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3d8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3d8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_388);
  return;
}

Assistant:

TEST(ProblemTest, AddObj) {
  Problem p;
  EXPECT_EQ(0, p.num_objs());

  p.AddObj(mp::obj::MIN);
  EXPECT_EQ(1, p.num_objs());
  Problem::Objective obj = p.obj(0);
  EXPECT_EQ(mp::obj::MIN, obj.type());
  EXPECT_TRUE(!obj.nonlinear_expr());
  EXPECT_EQ(0, obj.linear_expr().num_terms());

  p.AddObj(mp::obj::MAX, mp::NumericExpr());
  EXPECT_EQ(2, p.num_objs());
  obj = p.obj(1);
  EXPECT_EQ(mp::obj::MAX, obj.type());
  EXPECT_TRUE(!obj.nonlinear_expr());
  EXPECT_EQ(0, obj.linear_expr().num_terms());

  auto nl_expr = p.MakeNumericConstant(42);
  Problem::LinearObjBuilder builder = p.AddObj(mp::obj::MIN, nl_expr);
  builder.AddTerm(0, 1.1);
  builder.AddTerm(3, 2.2);
  EXPECT_EQ(3, p.num_objs());
  obj = p.obj(2);
  EXPECT_EQ(mp::obj::MIN, obj.type());
  const int indices[] = {0, 3};
  const double coefs[] = {1.1, 2.2};
  EXPECT_LINEAR_EXPR(obj.linear_expr(), indices, coefs);
}